

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.hpp
# Opt level: O3

void DeleteMatrix(SparseMatrix *A)

{
  Geometry *pGVar1;
  SparseMatrix_STRUCT *pSVar2;
  pointer plVar3;
  long lVar4;
  
  if (0 < A->localNumberOfRows) {
    lVar4 = 0;
    do {
      if (A->matrixValues[lVar4] != (double *)0x0) {
        operator_delete__(A->matrixValues[lVar4]);
      }
      if (A->mtxIndG[lVar4] != (global_int_t *)0x0) {
        operator_delete__(A->mtxIndG[lVar4]);
      }
      if (A->mtxIndL[lVar4] != (local_int_t *)0x0) {
        operator_delete__(A->mtxIndL[lVar4]);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < A->localNumberOfRows);
  }
  if (A->title != (char *)0x0) {
    operator_delete__(A->title);
  }
  if (A->nonzerosInRow != (char *)0x0) {
    operator_delete__(A->nonzerosInRow);
  }
  if (A->mtxIndG != (global_int_t **)0x0) {
    operator_delete__(A->mtxIndG);
  }
  if (A->mtxIndL != (local_int_t **)0x0) {
    operator_delete__(A->mtxIndL);
  }
  if (A->matrixValues != (double **)0x0) {
    operator_delete__(A->matrixValues);
  }
  if (A->matrixDiagonal != (double **)0x0) {
    operator_delete__(A->matrixDiagonal);
  }
  pGVar1 = A->geom;
  if (pGVar1 != (Geometry *)0x0) {
    if (pGVar1->partz_nz != (local_int_t *)0x0) {
      operator_delete__(pGVar1->partz_nz);
    }
    if (pGVar1->partz_ids != (int *)0x0) {
      operator_delete__(pGVar1->partz_ids);
    }
    operator_delete(A->geom,0x80);
    A->geom = (Geometry *)0x0;
  }
  if (A->Ac != (SparseMatrix *)0x0) {
    DeleteMatrix(A->Ac);
    pSVar2 = A->Ac;
    if (pSVar2 != (SparseMatrix_STRUCT *)0x0) {
      plVar3 = (pSVar2->localToGlobalMap).super__Vector_base<long_long,_std::allocator<long_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (plVar3 != (pointer)0x0) {
        operator_delete(plVar3,(long)(pSVar2->localToGlobalMap).
                                     super__Vector_base<long_long,_std::allocator<long_long>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)plVar3);
      }
      std::
      _Hashtable<long_long,_std::pair<const_long_long,_int>,_std::allocator<std::pair<const_long_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&(pSVar2->globalToLocalMap)._M_h);
    }
    operator_delete(pSVar2,200);
    A->Ac = (SparseMatrix_STRUCT *)0x0;
  }
  if (A->mgData != (MGData *)0x0) {
    DeleteMGData(A->mgData);
    operator_delete(A->mgData,0x30);
    A->mgData = (MGData *)0x0;
  }
  return;
}

Assistant:

inline void DeleteMatrix(SparseMatrix & A) {

#ifndef HPCG_CONTIGUOUS_ARRAYS
  for (local_int_t i = 0; i< A.localNumberOfRows; ++i) {
    delete [] A.matrixValues[i];
    delete [] A.mtxIndG[i];
    delete [] A.mtxIndL[i];
  }
#else
  delete [] A.matrixValues[0];
  delete [] A.mtxIndG[0];
  delete [] A.mtxIndL[0];
#endif
  if (A.title)                  delete [] A.title;
  if (A.nonzerosInRow)             delete [] A.nonzerosInRow;
  if (A.mtxIndG) delete [] A.mtxIndG;
  if (A.mtxIndL) delete [] A.mtxIndL;
  if (A.matrixValues) delete [] A.matrixValues;
  if (A.matrixDiagonal)           delete [] A.matrixDiagonal;

#ifndef HPCG_NO_MPI
  if (A.elementsToSend)       delete [] A.elementsToSend;
  if (A.neighbors)              delete [] A.neighbors;
  if (A.receiveLength)            delete [] A.receiveLength;
  if (A.sendLength)            delete [] A.sendLength;
  if (A.sendBuffer)            delete [] A.sendBuffer;
#endif

  if (A.geom!=0) { DeleteGeometry(*A.geom); delete A.geom; A.geom = 0;}
  if (A.Ac!=0) { DeleteMatrix(*A.Ac); delete A.Ac; A.Ac = 0;} // Delete coarse matrix
  if (A.mgData!=0) { DeleteMGData(*A.mgData); delete A.mgData; A.mgData = 0;} // Delete MG data
  return;
}